

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStatsdClient.cpp
# Opt level: O2

void throwOnWrongMessage(StatsdServer *server,string *expected)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *this;
  string actual;
  
  Statsd::StatsdServer::receive_abi_cxx11_(&actual,server);
  bVar1 = std::operator!=(&actual,expected);
  if (!bVar1) {
    std::__cxx11::string::~string((string *)&actual);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Expected: ");
  poVar2 = std::operator<<(poVar2,(string *)expected);
  poVar2 = std::operator<<(poVar2," but got: ");
  poVar2 = std::operator<<(poVar2,(string *)&actual);
  std::endl<char,std::char_traits<char>>(poVar2);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Incorrect stat received");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throwOnWrongMessage(StatsdServer& server, const std::string& expected) {
    auto actual = server.receive();
    if (actual != expected) {
        std::cerr << "Expected: " << expected << " but got: " << actual << std::endl;
        throw std::runtime_error("Incorrect stat received");
    }
}